

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O0

void __thiscall
duckdb::BatchedBufferedData::Append(BatchedBufferedData *this,DataChunk *to_append,idx_t batch)

{
  bool bVar1;
  pointer this_00;
  DataChunk *this_01;
  type other;
  InternalException *this_02;
  mapped_type *__x;
  idx_t in_RDX;
  _Base_ptr in_RSI;
  BatchedBufferedData *in_RDI;
  deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  *chunks;
  mapped_type *in_progress_batch;
  unsigned_long batch_index;
  pair<const_unsigned_long,_duckdb::InProgressBatch> *it;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  *__range2;
  bool is_minimum;
  lock_guard<std::mutex> lock;
  idx_t allocation_size;
  templated_unique_single_t chunk;
  string *in_stack_fffffffffffffee8;
  deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  *in_stack_fffffffffffffef0;
  map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  *this_03;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff40;
  Allocator *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [32];
  ulong local_88;
  reference local_80;
  _Self local_78;
  _Self local_70;
  map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  *local_68;
  undefined1 local_59;
  lock_guard<std::mutex> local_58;
  idx_t local_50;
  idx_t local_18;
  _Base_ptr local_10;
  
  this_03 = (map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
             *)&stack0xffffffffffffffe0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  make_uniq<duckdb::DataChunk>();
  this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                      ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                        *)in_stack_fffffffffffffef0);
  this_01 = (DataChunk *)Allocator::DefaultAllocator();
  DataChunk::GetTypes(this_00);
  DataChunk::Initialize
            ((DataChunk *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(idx_t)this_00);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x196ab4d);
  other = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                     in_stack_fffffffffffffef0);
  DataChunk::Copy(this_01,other,(idx_t)local_10);
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
             in_stack_fffffffffffffef0);
  local_50 = DataChunk::GetAllocationSize(this_01);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)in_stack_fffffffffffffee8);
  local_59 = IsMinimumBatchIndex(in_RDI,&local_58,local_18);
  if ((bool)local_59) {
    local_68 = &in_RDI->buffer;
    local_70._M_node =
         (_Base_ptr)
         ::std::
         map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
         ::begin((map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
                  *)in_stack_fffffffffffffee8);
    local_78._M_node =
         (_Base_ptr)
         ::std::
         map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
         ::end((map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
                *)in_stack_fffffffffffffee8);
    bVar1 = ::std::operator!=(&local_70,&local_78);
    if (bVar1) {
      local_80 = ::std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>
                              *)0x196ac64);
      local_88 = local_80->first;
      if (local_88 < in_RDI->min_batch) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a8,"Batches remaining in buffer",(allocator *)&stack0xffffffffffffff57);
        InternalException::InternalException(this_02,in_stack_fffffffffffffee8);
        __cxa_throw(this_02,&InternalException::typeinfo,InternalException::~InternalException);
      }
    }
    ::std::
    deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ::push_back(in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
    ::std::__atomic_base<unsigned_long>::operator+=
              (&(in_RDI->read_queue_byte_count).super___atomic_base<unsigned_long>,local_50);
  }
  else {
    __x = ::std::
          map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
          ::operator[](this_03,(key_type *)in_RDI);
    __x->completed = false;
    ::std::__atomic_base<unsigned_long>::operator+=
              (&(in_RDI->buffer_byte_count).super___atomic_base<unsigned_long>,local_50);
    ::std::
    deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ::push_back(in_stack_fffffffffffffef0,(value_type *)__x);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x196ae63);
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
             0x196ae70);
  return;
}

Assistant:

void BatchedBufferedData::Append(const DataChunk &to_append, idx_t batch) {
	// We should never find any chunks with a smaller batch index than the minimum

	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	lock_guard<mutex> lock(glock);
	D_ASSERT(batch >= min_batch);
	auto is_minimum = IsMinimumBatchIndex(lock, batch);
	if (is_minimum) {
		for (auto &it : buffer) {
			auto batch_index = it.first;
			if (batch_index >= min_batch) {
				break;
			}
			// There should not be any batches in the buffer that are lower or equal to the minimum batch index
			throw InternalException("Batches remaining in buffer");
		}
		read_queue.push_back(std::move(chunk));
		read_queue_byte_count += allocation_size;
	} else {
		auto &in_progress_batch = buffer[batch];
		auto &chunks = in_progress_batch.chunks;
		in_progress_batch.completed = false;
		buffer_byte_count += allocation_size;
		chunks.push_back(std::move(chunk));
	}
}